

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Combine<duckdb::ArgMinMaxState<duckdb::date_t,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (ArgMinMaxState<duckdb::date_t,_duckdb::hugeint_t> *source,
               ArgMinMaxState<duckdb::date_t,_duckdb::hugeint_t> *target,AggregateInputData *param_3
               )

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  
  if ((source->super_ArgMinMaxStateBase).is_initialized != true) {
    return;
  }
  if ((target->super_ArgMinMaxStateBase).is_initialized == true) {
    lVar1 = (target->value).upper;
    lVar2 = (source->value).upper;
    if ((lVar1 <= lVar2) && ((target->value).lower <= (source->value).lower || lVar1 != lVar2)) {
      return;
    }
  }
  (target->arg).days = (source->arg).days;
  iVar3 = (source->value).upper;
  (target->value).lower = (source->value).lower;
  (target->value).upper = iVar3;
  (target->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}